

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractDemuxer.h
# Opt level: O2

void __thiscall AbstractDemuxer::AbstractDemuxer(AbstractDemuxer *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_AbstractDemuxer = (_func_int **)&PTR__AbstractDemuxer_00249b00;
  p_Var1 = &(this->m_pidFilters)._M_t._M_impl.super__Rb_tree_header;
  (this->m_pidFilters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_pidFilters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_pidFilters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_pidFilters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_pidFilters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_fileBlockSize = 0x200000;
  this->m_timeOffset = 0;
  return;
}

Assistant:

AbstractDemuxer()
    {
        m_fileBlockSize = DEFAULT_FILE_BLOCK_SIZE;
        m_timeOffset = 0;
    }